

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# munkres.hxx
# Opt level: O2

value_type __thiscall
markurem::matching::
Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
::find_smallest(Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
                *this)

{
  double dVar1;
  size_type *psVar2;
  const_reference cVar3;
  size_type sVar4;
  pointer pVVar5;
  pointer pAVar6;
  size_type *psVar7;
  value_type local_38;
  
  psVar7 = (this->rows_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  psVar2 = (this->rows_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_38 = 1.79769313486232e+308;
  for (; psVar7 != psVar2; psVar7 = psVar7 + 1) {
    cVar3 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->row_cover,*psVar7);
    if (!cVar3) {
      sVar4 = *psVar7;
      pVVar5 = (this->graph_->vertices_).
               super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
               ._M_impl.super__Vector_impl_data._M_start;
      for (pAVar6 = *(pointer *)&((Adjacencies *)((long)(pVVar5 + sVar4) + 0x20))->vector_;
          pAVar6 != *(pointer *)((long)(pVVar5 + sVar4) + 0x28); pAVar6 = pAVar6 + 1) {
        cVar3 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          (&this->col_cover,
                           pAVar6->vertex_ -
                           ((long)(this->rows_).
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->rows_).
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start >> 3));
        if ((!cVar3) &&
           (dVar1 = (this->costs_->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start[pAVar6->edge_], dVar1 < local_38)) {
          local_38 = dVar1;
        }
        sVar4 = *psVar7;
        pVVar5 = (this->graph_->vertices_).
                 super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
    }
  }
  return local_38;
}

Assistant:

typename Matching<GRAPH, COST, MASK>::value_type
Matching<GRAPH, COST, MASK>::find_smallest() const
{
    auto minval = std::numeric_limits<value_type>::max();
    for (auto const& row : rows_) {
        // consider only non-covered rows.
        if (row_cover[row])
            continue;
        for (auto it = graph_.adjacenciesFromVertexBegin(row);
             it != graph_.adjacenciesFromVertexEnd(row); ++it)
            // consider only non-covered columns.
            if (!col_cover[col_of_idx(it->vertex())] &&
                costs_[it->edge()] < minval)
                minval = costs_[it->edge()];
    }
    return minval;
}